

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

bool __thiscall testing::internal::DeathTestImpl::Passed(DeathTestImpl *this,bool status_ok)

{
  ostream *poVar1;
  ostream *poVar2;
  uint uVar3;
  _Alloc_hider ss;
  bool bVar4;
  size_t sVar5;
  uint uVar6;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ss_00;
  pointer *__ptr;
  bool bVar7;
  char *__s;
  string error_message;
  ostringstream stream;
  string local_208;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0 [3];
  ios_base local_130 [264];
  
  if (this->spawned_ != true) {
    return false;
  }
  (*(this->super_DeathTest)._vptr_DeathTest[6])(&local_1e0,this);
  Message::Message((Message *)&local_1e8);
  ss_00._M_head_impl = local_1e8._M_head_impl;
  poVar1 = (ostream *)(local_1e8._M_head_impl + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Death test: ",0xc);
  __s = this->statement_;
  if (__s == (char *)0x0) {
    sVar5 = 6;
    __s = "(null)";
  }
  else {
    sVar5 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  switch(this->outcome_) {
  case DIED:
    if (status_ok) {
      local_1a0[0]._M_string_length = 0;
      local_1a0[0]._M_dataplus._M_p = (pointer)&PTR__MatchResultListener_0016c240;
      bVar4 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::MatchAndExplain(&(this->matcher_).
                                 super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                                ,&local_1e0,(MatchResultListener *)local_1a0);
      bVar7 = true;
      if (bVar4) goto LAB_0012115c;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::DescribeTo(&(this->matcher_).
                    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                   ,(ostream *)local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"    Result: died but not with expected error.\n",0x2e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  Expected: ",0xc);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_208._M_dataplus._M_p,local_208._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Actual msg:\n",0xc);
      FormatDeathTestOutput(&local_1c0,&local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      std::ios_base::~ios_base(local_130);
      local_1e8._M_head_impl = ss_00._M_head_impl;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,"    Result: died but not with expected exit code:\n",0x32);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"            ",0xc);
      uVar3 = this->status_;
      Message::Message((Message *)&local_208);
      ss._M_p = local_208._M_dataplus._M_p;
      uVar6 = uVar3 & 0x7f;
      if (uVar6 == 0) {
        poVar2 = (ostream *)(local_208._M_dataplus._M_p + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Exited with exit status ",0x18);
        std::ostream::operator<<((ostream *)poVar2,uVar3 >> 8 & 0xff);
      }
      else if (0x1ffffff < (int)(uVar6 * 0x1000000 + 0x1000000)) {
        poVar2 = (ostream *)(local_208._M_dataplus._M_p + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Terminated by signal ",0x15);
        std::ostream::operator<<((ostream *)poVar2,uVar6);
      }
      if ((char)uVar3 < '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(ss._M_p + 0x10)," (core dumped)",0xe);
      }
      StringStreamToString(local_1a0,(stringstream *)ss._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ss._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)ss._M_p + 8))(ss._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_1a0[0]._M_dataplus._M_p,local_1a0[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Actual msg:\n",0xc);
      FormatDeathTestOutput(&local_208,&local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,local_208._M_dataplus._M_p,local_208._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
        operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1
                       );
      }
    }
    goto LAB_0012115a;
  case LIVED:
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    Result: failed to die.\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," Error msg:\n",0xc);
    FormatDeathTestOutput(local_1a0,&local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_1a0[0]._M_dataplus._M_p,local_1a0[0]._M_string_length);
    break;
  case RETURNED:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    Result: illegal return in test statement.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," Error msg:\n",0xc);
    FormatDeathTestOutput(local_1a0,&local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_1a0[0]._M_dataplus._M_p,local_1a0[0]._M_string_length);
    break;
  case THREW:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"    Result: threw an exception.\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," Error msg:\n",0xc);
    FormatDeathTestOutput(local_1a0,&local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_1a0[0]._M_dataplus._M_p,local_1a0[0]._M_string_length);
    break;
  default:
    GTestLog::GTestLog((GTestLog *)local_1a0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       ,0x26c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"DeathTest::Passed somehow called before conclusion of test",
               0x3a);
    GTestLog::~GTestLog((GTestLog *)local_1a0);
    local_1e8._M_head_impl = ss_00._M_head_impl;
    goto LAB_0012115a;
  }
  local_1e8._M_head_impl = ss_00._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
LAB_0012115a:
  bVar7 = false;
  ss_00._M_head_impl = local_1e8._M_head_impl;
LAB_0012115c:
  StringStreamToString(local_1a0,ss_00._M_head_impl);
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  if (ss_00._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)ss_00._M_head_impl + 8))(ss_00._M_head_impl);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool DeathTestImpl::Passed(bool status_ok) {
  if (!spawned()) return false;

  const std::string error_message = GetErrorLogs();

  bool success = false;
  Message buffer;

  buffer << "Death test: " << statement() << "\n";
  switch (outcome()) {
    case LIVED:
      buffer << "    Result: failed to die.\n"
             << " Error msg:\n"
             << FormatDeathTestOutput(error_message);
      break;
    case THREW:
      buffer << "    Result: threw an exception.\n"
             << " Error msg:\n"
             << FormatDeathTestOutput(error_message);
      break;
    case RETURNED:
      buffer << "    Result: illegal return in test statement.\n"
             << " Error msg:\n"
             << FormatDeathTestOutput(error_message);
      break;
    case DIED:
      if (status_ok) {
        if (matcher_.Matches(error_message)) {
          success = true;
        } else {
          std::ostringstream stream;
          matcher_.DescribeTo(&stream);
          buffer << "    Result: died but not with expected error.\n"
                 << "  Expected: " << stream.str() << "\n"
                 << "Actual msg:\n"
                 << FormatDeathTestOutput(error_message);
        }
      } else {
        buffer << "    Result: died but not with expected exit code:\n"
               << "            " << ExitSummary(status()) << "\n"
               << "Actual msg:\n"
               << FormatDeathTestOutput(error_message);
      }
      break;
    case IN_PROGRESS:
    default:
      GTEST_LOG_(FATAL)
          << "DeathTest::Passed somehow called before conclusion of test";
  }

  DeathTest::set_last_death_test_message(buffer.GetString());
  return success;
}